

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionShapeBullet.h
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionShapeBullet::ChCollisionShapeBullet
          (ChCollisionShapeBullet *this,Type type,shared_ptr<chrono::ChMaterialSurface> *material)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<chrono::ChMaterialSurface> local_18;
  
  local_18.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var1 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChCollisionShape::ChCollisionShape(&this->super_ChCollisionShape,type,&local_18);
  if (local_18.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChCollisionShape)._vptr_ChCollisionShape =
       (_func_int **)&PTR__ChCollisionShapeBullet_00b3c0f8;
  this->m_bt_shape = (cbtCollisionShape *)0x0;
  return;
}

Assistant:

ChCollisionShapeBullet(Type type, std::shared_ptr<ChMaterialSurface> material)
        : ChCollisionShape(type, material), m_bt_shape(nullptr) {}